

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void convolutionInit(Weight *weight,pBox *pbox,pBox *outpBox)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mydataFmt *pmVar5;
  pBox *outpBox_00;
  
  iVar1 = weight->selfChannel;
  outpBox->channel = iVar1;
  iVar2 = weight->kernelSize;
  if (iVar2 == 0) {
    iVar4 = weight->stride;
    outpBox->width = ((pbox->width - weight->w) + weight->padw * 2) / iVar4 + 1;
    iVar4 = ((pbox->height - weight->h) + weight->padh * 2) / iVar4;
  }
  else {
    iVar4 = weight->stride;
    iVar3 = weight->pad;
    outpBox->width = ((pbox->width - iVar2) + iVar3 * 2) / iVar4 + 1;
    iVar4 = ((iVar3 * 2 - iVar2) + pbox->height) / iVar4;
  }
  outpBox->height = iVar4 + 1;
  pmVar5 = (mydataFmt *)malloc((long)(iVar1 * outpBox->width * (iVar4 + 1)) << 2);
  outpBox->pdata = pmVar5;
  if (pmVar5 == (mydataFmt *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the convolutionInit is failed!!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  memset(outpBox->pdata,0,(long)outpBox->channel * (long)outpBox->height * (long)outpBox->width * 4)
  ;
  iVar1 = weight->pad;
  if (iVar1 != 0) {
    outpBox_00 = (pBox *)operator_new(0x38);
    (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
    (outpBox_00->super_String)._M_string_length = 0;
    (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
    featurePadInit(pbox,outpBox_00,iVar1,weight->padw,weight->padh);
    featurePad(pbox,outpBox_00,weight->pad,weight->padw,weight->padh);
    std::__cxx11::string::_M_assign((string *)pbox);
    pbox->channel = outpBox_00->channel;
    iVar1 = outpBox_00->width;
    iVar2 = outpBox_00->height;
    pbox->pdata = outpBox_00->pdata;
    pbox->width = iVar1;
    pbox->height = iVar2;
  }
  return;
}

Assistant:

void convolutionInit(const Weight *weight, pBox *pbox, pBox *outpBox) {
    outpBox->channel = weight->selfChannel;
//    ((imginputh - ckh + 2 * ckpad) / stride) + 1;
    if (weight->kernelSize == 0) {
        outpBox->width = ((pbox->width - weight->w + 2 * weight->padw) / weight->stride) + 1;
//        outpBox->width = (pbox->width - weight->w) / weight->stride + 1;
//        outpBox->height = (pbox->height - weight->h) / weight->stride + 1;
        outpBox->height = (pbox->height - weight->h + 2 * weight->padh) / weight->stride + 1;
    } else {
        outpBox->width = ((pbox->width - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
        outpBox->height = ((pbox->height - weight->kernelSize + 2 * weight->pad) / weight->stride) + 1;
    }
//    cout << outpBox->pdata << endl;
    outpBox->pdata = (mydataFmt *) malloc(outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
//    cout << outpBox->pdata << endl;
    if (outpBox->pdata == NULL)cout << "the convolutionInit is failed!!" << endl;
    memset(outpBox->pdata, 0, outpBox->width * outpBox->height * outpBox->channel * sizeof(mydataFmt));
    if (weight->pad != 0) {
        pBox *padpbox = new pBox;
        featurePadInit(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        featurePad(pbox, padpbox, weight->pad, weight->padw, weight->padh);
        *pbox = *padpbox;
    }
}